

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O3

char * zt_cstr_path_append(char *path1,char *path2)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  
  sVar1 = strlen(path1);
  sVar2 = strlen(path2);
  uVar6 = sVar1 - 1;
  uVar7 = uVar6;
  do {
    uVar4 = (long)uVar6 >> 0x3f & uVar6;
    if ((long)uVar7 < 1) break;
    pcVar3 = path1 + uVar7;
    uVar4 = uVar7;
    uVar7 = uVar7 - 1;
  } while (*pcVar3 == '/');
  sVar5 = 0;
  sVar1 = sVar5;
  if (0 < (long)sVar2) {
    do {
      sVar1 = sVar5;
      if (path2[sVar5] != '/') break;
      sVar5 = sVar5 + 1;
      sVar1 = sVar2;
    } while (sVar2 != sVar5);
  }
  pcVar3 = zt_cstr_catv(path1,0,uVar4,"/",0,0xffffffff,path2,sVar1,0xffffffffffffffff,0);
  return pcVar3;
}

Assistant:

char *
zt_cstr_path_append(const char *path1, const char *path2) {
    char    * rpath = NULL;
    size_t    len1;
    size_t    len2;
    size_t    sep_len;
    ssize_t   x;
    ssize_t   y;

    len1    = strlen(path1);
    len2    = strlen(path2);
    sep_len = strlen(PATH_SEPERATOR);

    for (y = len1 - 1; y > 0 && strncmp(&path1[y], PATH_SEPERATOR, sep_len) == 0; y--) {
        ;
    }
    for (x = 0; x < (ssize_t)len2 && strncmp(&path2[x], PATH_SEPERATOR, sep_len) == 0; x++) {
        ;
    }

    rpath = zt_cstr_catv(path1, 0, y,
                         PATH_SEPERATOR, 0, -1,
                         path2, x, -1, NULL);
    return rpath;
}